

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphListExtract(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = pVertex->nEdges;
  if ((long)(int)uVar1 < 1) {
    __assert_fail("pVertex->nEdges > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                  ,0xf6,"void Nwk_ManGraphListExtract(Nwk_Grf_t *, Nwk_Vrt_t *)");
  }
  if (uVar1 == 1) {
    lVar2 = (long)p->pVerts[pVertex[1].Id]->nEdges;
    if (0xf < lVar2) {
      Nwk_ManGraphListDelete(p,p->pLists1 + 0x10,pVertex);
      return;
    }
    Nwk_ManGraphListDelete(p,p->pLists1 + lVar2,pVertex);
    return;
  }
  if (0xf < uVar1) {
    Nwk_ManGraphListDelete(p,p->pLists2 + 0x10,pVertex);
    return;
  }
  Nwk_ManGraphListDelete(p,p->pLists2 + (int)uVar1,pVertex);
  return;
}

Assistant:

static inline void Nwk_ManGraphListExtract( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex )
{
    Nwk_Vrt_t * pNext;
    assert( pVertex->nEdges > 0 );

    if ( pVertex->nEdges == 1 )
    {
        pNext = p->pVerts[ pVertex->pEdges[0] ];
        if ( pNext->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists1 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists1 + pNext->nEdges, pVertex );
    }
    else
    {
        if ( pVertex->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists2 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists2 + pVertex->nEdges, pVertex );
    }
}